

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

char * duckdb_brotli::BrotliDecoderErrorString(BrotliDecoderErrorCode c)

{
  BrotliDecoderErrorCode c_local;
  char *local_8;
  
  switch(c) {
  case BROTLI_DECODER_NO_ERROR:
    local_8 = "_NO_ERROR";
    break;
  case BROTLI_DECODER_SUCCESS:
    local_8 = "_SUCCESS";
    break;
  case BROTLI_DECODER_NEEDS_MORE_INPUT:
    local_8 = "_NEEDS_MORE_INPUT";
    break;
  case BROTLI_DECODER_NEEDS_MORE_OUTPUT:
    local_8 = "_NEEDS_MORE_OUTPUT";
    break;
  case BROTLI_DECODER_ERROR_UNREACHABLE:
    local_8 = "_ERROR_UNREACHABLE";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_BLOCK_TYPE_TREES:
    local_8 = "_ERROR_ALLOC_BLOCK_TYPE_TREES";
    break;
  default:
    local_8 = "INVALID";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_2:
    local_8 = "_ERROR_ALLOC_RING_BUFFER_2";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1:
    local_8 = "_ERROR_ALLOC_RING_BUFFER_1";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP:
    local_8 = "_ERROR_ALLOC_CONTEXT_MAP";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_TREE_GROUPS:
    local_8 = "_ERROR_ALLOC_TREE_GROUPS";
    break;
  case BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MODES:
    local_8 = "_ERROR_ALLOC_CONTEXT_MODES";
    break;
  case BROTLI_DECODER_ERROR_INVALID_ARGUMENTS:
    local_8 = "_ERROR_INVALID_ARGUMENTS";
    break;
  case BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET:
    local_8 = "_ERROR_DICTIONARY_NOT_SET";
    break;
  case BROTLI_DECODER_ERROR_COMPOUND_DICTIONARY:
    local_8 = "_ERROR_COMPOUND_DICTIONARY";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_DISTANCE:
    local_8 = "_ERROR_FORMAT_DISTANCE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_PADDING_2:
    local_8 = "_ERROR_FORMAT_PADDING_2";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_PADDING_1:
    local_8 = "_ERROR_FORMAT_PADDING_1";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_WINDOW_BITS:
    local_8 = "_ERROR_FORMAT_WINDOW_BITS";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_DICTIONARY:
    local_8 = "_ERROR_FORMAT_DICTIONARY";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_TRANSFORM:
    local_8 = "_ERROR_FORMAT_TRANSFORM";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_2:
    local_8 = "_ERROR_FORMAT_BLOCK_LENGTH_2";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1:
    local_8 = "_ERROR_FORMAT_BLOCK_LENGTH_1";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT:
    local_8 = "_ERROR_FORMAT_CONTEXT_MAP_REPEAT";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE:
    local_8 = "_ERROR_FORMAT_HUFFMAN_SPACE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_CL_SPACE:
    local_8 = "_ERROR_FORMAT_CL_SPACE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME:
    local_8 = "_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET:
    local_8 = "_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE:
    local_8 = "_ERROR_FORMAT_EXUBERANT_META_NIBBLE";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_RESERVED:
    local_8 = "_ERROR_FORMAT_RESERVED";
    break;
  case BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE:
    local_8 = "_ERROR_FORMAT_EXUBERANT_NIBBLE";
  }
  return local_8;
}

Assistant:

const char *BrotliDecoderErrorString(BrotliDecoderErrorCode c) {
	switch (c) {
#define BROTLI_ERROR_CODE_CASE_(PREFIX, NAME, CODE) \
    case BROTLI_DECODER##PREFIX##NAME: return #PREFIX #NAME;
#define BROTLI_NOTHING_
		BROTLI_DECODER_ERROR_CODES_LIST(BROTLI_ERROR_CODE_CASE_, BROTLI_NOTHING_)
#undef BROTLI_ERROR_CODE_CASE_
#undef BROTLI_NOTHING_
	default:
		return "INVALID";
	}
}